

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_negx_32_al(void)

{
  uint address;
  uint uVar1;
  uint value;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_32_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  value = -(m68ki_cpu.x_flag >> 8 & 1) - uVar1;
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.x_flag = (uVar1 & value | uVar1 | value) >> 0x17;
  m68ki_cpu.v_flag = (uVar1 & value) >> 0x18;
  m68ki_cpu.not_z_flag = value | m68ki_cpu.not_z_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_negx_32_al(void)
{
	uint ea  = EA_AL_32();
	uint src = m68ki_read_32(ea);
	uint res = 0 - MASK_OUT_ABOVE_32(src) - XFLAG_AS_1();

	FLAG_N = NFLAG_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, 0, res);
	FLAG_V = (src & res)>>24;

	res = MASK_OUT_ABOVE_32(res);
	FLAG_Z |= res;

	m68ki_write_32(ea, res);
}